

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O0

void saa1099_envelope_w(saa1099_state *saa,int ch)

{
  byte bVar1;
  byte local_18;
  byte local_17;
  UINT8 envval;
  UINT8 mask;
  UINT8 mode;
  UINT8 step;
  int ch_local;
  saa1099_state *saa_local;
  
  if (saa->env_enable[ch] == '\0') {
    saa->channels[ch * 3 + 2].envelope[1] = '\x10';
    saa->channels[ch * 3 + 1].envelope[1] = '\x10';
    saa->channels[ch * 3].envelope[1] = '\x10';
    saa->channels[ch * 3 + 2].envelope[0] = '\x10';
    saa->channels[ch * 3 + 1].envelope[0] = '\x10';
    saa->channels[ch * 3].envelope[0] = '\x10';
  }
  else {
    bVar1 = saa->env_step[ch] + 1 & 0x3f | saa->env_step[ch] & 0x20;
    saa->env_step[ch] = bVar1;
    local_17 = 0xf;
    if (saa->env_bits[ch] != '\0') {
      local_17 = 0xe;
    }
    local_18 = envelope[saa->env_mode[ch]][bVar1] & local_17;
    saa->channels[ch * 3 + 2].envelope[0] = local_18;
    saa->channels[ch * 3 + 1].envelope[0] = local_18;
    saa->channels[ch * 3].envelope[0] = local_18;
    if ((saa->env_reverse_right[ch] & 1) != 0) {
      local_18 = 0xf - local_18 & local_17;
    }
    saa->channels[ch * 3 + 2].envelope[1] = local_18;
    saa->channels[ch * 3 + 1].envelope[1] = local_18;
    saa->channels[ch * 3].envelope[1] = local_18;
  }
  return;
}

Assistant:

static void saa1099_envelope_w(saa1099_state *saa, int ch)
{
	if (saa->env_enable[ch])
	{
		UINT8 step, mode, mask, envval;
		mode = saa->env_mode[ch];
		/* step from 0..63 and then loop in steps 32..63 */
		step = saa->env_step[ch] =
			((saa->env_step[ch] + 1) & 0x3f) | (saa->env_step[ch] & 0x20);

		mask = 15;
		if (saa->env_bits[ch])
			mask &= ~1;     /* 3 bit resolution, mask LSB */

		envval = envelope[mode][step] & mask;
		saa->channels[ch*3+0].envelope[ LEFT] =
		saa->channels[ch*3+1].envelope[ LEFT] =
		saa->channels[ch*3+2].envelope[ LEFT] = envval;
		if (saa->env_reverse_right[ch] & 0x01)
			envval = (15 - envval) & mask;
		saa->channels[ch*3+0].envelope[RIGHT] =
		saa->channels[ch*3+1].envelope[RIGHT] =
		saa->channels[ch*3+2].envelope[RIGHT] = envval;
	}
	else
	{
		/* envelope mode off, set all envelope factors to 16 */
		saa->channels[ch*3+0].envelope[ LEFT] =
		saa->channels[ch*3+1].envelope[ LEFT] =
		saa->channels[ch*3+2].envelope[ LEFT] =
		saa->channels[ch*3+0].envelope[RIGHT] =
		saa->channels[ch*3+1].envelope[RIGHT] =
		saa->channels[ch*3+2].envelope[RIGHT] = 16;
	}
}